

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
cs::method_function::preprocess
          (method_function *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  __type _Var1;
  int iVar2;
  signal_types sVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  undefined8 uVar6;
  element_type *this_00;
  iterator iVar7;
  var_id *this_01;
  compile_error *this_02;
  bool bVar8;
  string *str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_1;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string *str;
  tree_type<cs::token_base_*> *it;
  iterator __end1;
  iterator __begin1;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  tree_type<cs::token_base_*> *t;
  _Self *in_stack_fffffffffffffbe8;
  internal_error *in_stack_fffffffffffffbf0;
  value_type *in_stack_fffffffffffffbf8;
  allocator *paVar9;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  iterator *in_stack_fffffffffffffc30;
  iterator *in_stack_fffffffffffffc38;
  compiler_type *in_stack_fffffffffffffd08;
  undefined6 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd16;
  allocator in_stack_fffffffffffffd17;
  string local_2e8 [38];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [32];
  tree_node *local_2a0;
  string *local_298;
  tree_node *local_290;
  undefined1 local_282;
  allocator local_281;
  string local_280 [32];
  reference local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  undefined1 *local_248;
  tree_node *local_240;
  string *local_238;
  tree_node *local_230;
  tree_node *local_228;
  undefined1 local_21a;
  allocator local_219;
  string local_218 [32];
  tree_node *local_1f8;
  reference local_1f0;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_1c8;
  tree_node *local_1a8;
  tree_node *local_1a0;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_198;
  undefined1 local_190 [30];
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  tree_node *local_150;
  tree_node *local_148;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  tree_node *local_118;
  tree_node *local_110;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  tree_node *local_e0;
  tree_node *local_d8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  tree_node *local_a8;
  tree_node *local_a0;
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  tree_node *local_70;
  tree_node *local_68;
  undefined1 local_5d;
  allocator local_49;
  string local_48 [32];
  tree_node *local_28;
  tree_type<cs::token_base_*> *local_20;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_fffffffffffffc00);
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
  local_20 = token_expr::get_tree((token_expr *)*pptVar4);
  local_28 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
  if (*pptVar5 == (token_base *)0x0) {
    local_5d = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    paVar9 = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Null pointer accessed.",paVar9);
    internal_error::internal_error(in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
    local_5d = 0;
    __cxa_throw(uVar6,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_68 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
  iVar2 = (*(*pptVar5)->_vptr_token_base[2])();
  bVar8 = true;
  if (iVar2 == 3) {
    local_70 = (tree_node *)
               tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
    pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
    sVar3 = token_signal::get_signal((token_signal *)*pptVar5);
    bVar8 = sVar3 != fcall_;
  }
  if (bVar8) {
    local_92 = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Wrong grammar for function definition.",&local_91);
    compile_error::compile_error
              ((compile_error *)in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
    local_92 = 0;
    __cxa_throw(uVar6,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_a8 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
  local_a0 = (tree_node *)tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffffc38);
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
  if (*pptVar5 == (token_base *)0x0) {
    local_ca = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Null pointer accessed.",&local_c9);
    internal_error::internal_error(in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
    local_ca = 0;
    __cxa_throw(uVar6,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_e0 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
  local_d8 = (tree_node *)tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffffc38);
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
  iVar2 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar2 != 4) {
    local_102 = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"Wrong grammar for function definition, expect function name.",&local_101);
    compile_error::compile_error
              ((compile_error *)in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
    local_102 = 0;
    __cxa_throw(uVar6,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_118 = (tree_node *)
              tree_type<cs::token_base_*>::root
                        ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
  local_110 = (tree_node *)tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffffc38);
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
  if (*pptVar5 == (token_base *)0x0) {
    local_13a = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Null pointer accessed.",&local_139);
    internal_error::internal_error(in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
    local_13a = 0;
    __cxa_throw(uVar6,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_150 = (tree_node *)
              tree_type<cs::token_base_*>::root
                        ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
  local_148 = (tree_node *)tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffffc38);
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
  iVar2 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar2 != 0xd) {
    local_172 = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_170,"Wrong grammar for function definition, expect argument list.",&local_171);
    compile_error::compile_error
              ((compile_error *)in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
    local_172 = 0;
    __cxa_throw(uVar6,&compile_error::typeinfo,compile_error::~compile_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x23e7e0);
  local_1a8 = (tree_node *)
              tree_type<cs::token_base_*>::root
                        ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
  local_1a0 = (tree_node *)tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffffc38);
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
  local_198 = token_arglist::get_arglist((token_arglist *)*pptVar5);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffffbe8);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *)
      in_stack_fffffffffffffbe8);
  do {
    bVar8 = std::operator!=((_Self *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    if (!bVar8) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc00);
      return;
    }
    local_1f0 = std::
                _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                ::operator*(&local_1c8);
    local_1f8 = (tree_node *)
                tree_type<cs::token_base_*>::root
                          ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
    pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
    if (*pptVar5 == (token_base *)0x0) {
      local_21a = 1;
      uVar6 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,"Null pointer accessed.",&local_219);
      internal_error::internal_error(in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
      local_21a = 0;
      __cxa_throw(uVar6,&internal_error::typeinfo,internal_error::~internal_error);
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x23ea1c);
    this_00 = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x23ea24);
    local_228 = (tree_node *)
                tree_type<cs::token_base_*>::root
                          ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
    iVar7.mData._6_1_ = in_stack_fffffffffffffd16;
    iVar7.mData._0_6_ = in_stack_fffffffffffffd10;
    iVar7.mData._7_1_ = in_stack_fffffffffffffd17;
    compiler_type::try_fix_this_deduction(in_stack_fffffffffffffd08,iVar7);
    iVar7 = tree_type<cs::token_base_*>::root
                      ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
    local_230 = iVar7.mData;
    pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
    iVar2 = (*(*pptVar5)->_vptr_token_base[2])();
    if (iVar2 == 4) {
      local_240 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
      this_01 = token_id::get_id((token_id *)*pptVar5);
      local_238 = var_id::operator_cast_to_string_(this_01);
      local_248 = local_190;
      local_250._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffbe8);
      local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffbe8);
      while( true ) {
        bVar8 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffbf0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffbe8);
        if (!bVar8) break;
        local_260 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_250);
        _Var1 = std::operator==(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        if (_Var1) {
          local_282 = 1;
          uVar6 = __cxa_allocate_exception(0x28);
          paVar9 = &local_281;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_280,"Redefinition of function argument.",paVar9);
          compile_error::compile_error
                    ((compile_error *)in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8)
          ;
          local_282 = 0;
          __cxa_throw(uVar6,&compile_error::typeinfo,compile_error::~compile_error);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_250);
      }
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x23ec88);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x23ec94);
      domain_manager::add_record((domain_manager *)this_00,(string *)iVar7.mData);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    }
    else {
      local_290 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
      iVar2 = (*(*pptVar5)->_vptr_token_base[2])();
      if (iVar2 != 5) {
        this_02 = (compile_error *)__cxa_allocate_exception(0x28);
        paVar9 = (allocator *)&stack0xfffffffffffffd17;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2e8,"Unexpected element in function argument list.",paVar9);
        compile_error::compile_error(this_02,(string *)in_stack_fffffffffffffbe8);
        __cxa_throw(this_02,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_2a0 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffc10 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffc30);
      local_298 = token_vargs::get_id_abi_cxx11_(*(token_vargs **)in_stack_fffffffffffffc10);
      bVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffc00);
      if (!bVar8) {
        local_2c2 = 1;
        uVar6 = __cxa_allocate_exception(0x28);
        paVar9 = &local_2c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2c0,"Redefinition of function argument(Multi-define of vargs).",paVar9);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
        local_2c2 = 0;
        __cxa_throw(uVar6,&compile_error::typeinfo,compile_error::~compile_error);
      }
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x23ee58);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x23ee64);
      domain_manager::add_record((domain_manager *)this_00,(string *)iVar7.mData);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    }
    std::
    _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
    ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                  *)in_stack_fffffffffffffbf0);
  } while( true );
}

Assistant:

void method_function::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::signal ||
		        static_cast<token_signal *>(t.root().data())->get_signal() != signal_types::fcall_)
			throw compile_error("Wrong grammar for function definition.");
		if (t.root().left().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().left().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar for function definition, expect function name.");
		if (t.root().right().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().right().data()->get_type() != token_types::arglist)
			throw compile_error("Wrong grammar for function definition, expect argument list.");
		std::vector<std::string> args;
		for (auto &it: static_cast<token_arglist *>(t.root().right().data())->get_arglist()) {
			if (it.root().data() == nullptr)
				throw internal_error("Null pointer accessed.");
			context->compiler->try_fix_this_deduction(it.root());
			if (it.root().data()->get_type() == token_types::id) {
				const std::string &str = static_cast<token_id *>(it.root().data())->get_id();
				for (auto &it: args)
					if (it == str)
						throw compile_error("Redefinition of function argument.");
				context->instance->storage.add_record(str);
				args.push_back(str);
			}
			else if (it.root().data()->get_type() == token_types::vargs) {
				const std::string &str = static_cast<token_vargs *>(it.root().data())->get_id();
				if (!args.empty())
					throw compile_error("Redefinition of function argument(Multi-define of vargs).");
				context->instance->storage.add_record(str);
				args.push_back(str);
			}
			else
				throw compile_error("Unexpected element in function argument list.");
		}
	}